

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

void __thiscall absl::lts_20250127::crc_internal::CRC32::InitTables(CRC32 *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t *t;
  long lVar5;
  uint32_t *puVar6;
  long lVar7;
  uint *extraout_RDX;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t *t_00;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  t = (uint32_t *)operator_new__(0x1000);
  uVar10 = 0x82f63b78;
  CRCImpl::FillWordTable(0x82f63b78,0x82f63b78,1,(Uint32By256 *)t);
  memcpy(this->table0_,t,0x400);
  lVar5 = 0xc;
  do {
    uVar9 = (uint)(uVar10 >> 8) ^ this->table0_[uVar10 & 0xff];
    uVar10 = (ulong)uVar9;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  puVar6 = t;
  CRCImpl::FillWordTable(0x82f63b78,uVar9,4,(Uint32By256 *)t);
  lVar5 = 0;
  do {
    memcpy((void *)((long)this->table_[0] + lVar5),(void *)((long)t + lVar5),0x400);
    lVar5 = lVar5 + 0x400;
  } while (lVar5 != 0x1000);
  lVar5 = 0x82f63b78;
  t_00 = t;
  uVar9 = CRCImpl::FillZeroesTable(0x82f63b78,(Uint32By256 *)t);
  if ((int)uVar9 < 0x101) {
    if (0 < (int)uVar9) {
      memcpy(this->zeroes_,t,(ulong)uVar9 << 2);
    }
    operator_delete__(t);
    puVar6 = this->reverse_table0_;
    CRCImpl::FillWordTable(0x8f6e37a0,0x8f6e37a0,1,&puVar6);
    t_00 = this->reverse_zeroes_;
    lVar5 = 0x8f6e37a0;
    iVar4 = CRCImpl::FillZeroesTable(0x8f6e37a0,&t_00);
    if (iVar4 < 0x101) {
      return;
    }
  }
  else {
    InitTables();
  }
  InitTables();
  puVar1 = (uint *)((long)extraout_RDX + (long)puVar6);
  uVar9 = *t_00;
  puVar8 = extraout_RDX;
  if ((uint32_t *)0xf < puVar6) {
    uVar9 = uVar9 ^ *extraout_RDX;
    uVar11 = extraout_RDX[1];
    uVar14 = extraout_RDX[2];
    uVar13 = extraout_RDX[3];
    puVar8 = extraout_RDX + 4;
    if ((long)puVar6 < 0x111) {
      puVar6 = puVar6 + -4;
    }
    else {
      puVar6 = puVar6 + -4;
      do {
        uVar9 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar9 & 0xff) * 4) ^ *puVar8 ^
                *(uint *)(lVar5 + 0x1008 + (ulong)(uVar9 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar5 + 0xc08 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar5 + 0x808 + (ulong)(uVar9 >> 0x18) * 4);
        uVar11 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar11 & 0xff) * 4) ^ puVar8[1] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar11 >> 0x18) * 4);
        uVar14 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar14 & 0xff) * 4) ^ puVar8[2] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar14 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar14 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar8[3] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        uVar9 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar9 & 0xff) * 4) ^ puVar8[4] ^
                *(uint *)(lVar5 + 0x1008 + (ulong)(uVar9 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar5 + 0xc08 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar5 + 0x808 + (ulong)(uVar9 >> 0x18) * 4);
        uVar11 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar11 & 0xff) * 4) ^ puVar8[5] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar11 >> 0x18) * 4);
        uVar14 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar14 & 0xff) * 4) ^ puVar8[6] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar14 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar14 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar8[7] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        uVar9 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar9 & 0xff) * 4) ^ puVar8[8] ^
                *(uint *)(lVar5 + 0x1008 + (ulong)(uVar9 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar5 + 0xc08 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar5 + 0x808 + (ulong)(uVar9 >> 0x18) * 4);
        uVar11 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar11 & 0xff) * 4) ^ puVar8[9] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar11 >> 0x18) * 4);
        uVar14 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar14 & 0xff) * 4) ^ puVar8[10] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar14 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar14 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar8[0xb] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        uVar9 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar9 & 0xff) * 4) ^ puVar8[0xc] ^
                *(uint *)(lVar5 + 0x1008 + (ulong)(uVar9 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar5 + 0xc08 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar5 + 0x808 + (ulong)(uVar9 >> 0x18) * 4);
        uVar11 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar11 & 0xff) * 4) ^ puVar8[0xd] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar11 >> 0x18) * 4);
        uVar14 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar14 & 0xff) * 4) ^ puVar8[0xe] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar14 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar14 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar8[0xf] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        puVar8 = puVar8 + 0x10;
        puVar6 = puVar6 + -0x10;
      } while (0x100 < (long)puVar6);
    }
    if ((uint32_t *)0xf < puVar6) {
      puVar6 = (uint32_t *)((long)puVar1 - (long)puVar8);
      do {
        uVar9 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar9 & 0xff) * 4) ^ *puVar8 ^
                *(uint *)(lVar5 + 0x1008 + (ulong)(uVar9 >> 8 & 0xff) * 4) ^
                *(uint *)(lVar5 + 0xc08 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^
                *(uint *)(lVar5 + 0x808 + (ulong)(uVar9 >> 0x18) * 4);
        uVar11 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar11 & 0xff) * 4) ^ puVar8[1] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar11 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar11 >> 0x18) * 4);
        uVar14 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar14 & 0xff) * 4) ^ puVar8[2] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar14 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar14 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar14 >> 0x18) * 4);
        uVar13 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar13 & 0xff) * 4) ^ puVar8[3] ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar13 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar13 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar13 >> 0x18) * 4);
        puVar8 = puVar8 + 4;
        puVar6 = puVar6 + -4;
      } while ((uint32_t *)0xf < puVar6);
    }
    if (&DAT_00000004 <= puVar6) {
      uVar10 = (long)puVar1 - (long)puVar8;
      uVar12 = uVar9;
      uVar2 = uVar11;
      uVar3 = uVar14;
      do {
        uVar14 = uVar13;
        uVar11 = uVar3;
        uVar9 = uVar2;
        uVar13 = *(uint *)(lVar5 + 0x1408 + (ulong)(uVar12 & 0xff) * 4) ^ *puVar8 ^
                 *(uint *)(lVar5 + 0x1008 + (ulong)(uVar12 >> 8 & 0xff) * 4) ^
                 *(uint *)(lVar5 + 0xc08 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^
                 *(uint *)(lVar5 + 0x808 + (ulong)(uVar12 >> 0x18) * 4);
        puVar8 = puVar8 + 1;
        uVar10 = uVar10 - 4;
        uVar12 = uVar9;
        uVar2 = uVar11;
        uVar3 = uVar14;
      } while (3 < uVar10);
    }
    lVar7 = 4;
    do {
      uVar9 = uVar9 >> 8 ^ *(uint *)(lVar5 + 8 + ((ulong)uVar9 & 0xff) * 4);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    uVar9 = uVar9 ^ uVar11;
    lVar7 = 4;
    do {
      uVar9 = uVar9 >> 8 ^ *(uint *)(lVar5 + 8 + (ulong)(uVar9 & 0xff) * 4);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    uVar9 = uVar9 ^ uVar14;
    lVar7 = 4;
    do {
      uVar9 = uVar9 >> 8 ^ *(uint *)(lVar5 + 8 + (ulong)(uVar9 & 0xff) * 4);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    uVar9 = uVar9 ^ uVar13;
    lVar7 = 4;
    do {
      uVar9 = uVar9 >> 8 ^ *(uint *)(lVar5 + 8 + (ulong)(uVar9 & 0xff) * 4);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  for (; puVar8 != puVar1; puVar8 = (uint *)((long)puVar8 + 1)) {
    uVar9 = uVar9 >> 8 ^ *(uint *)(lVar5 + 8 + (ulong)((uint)(byte)*puVar8 ^ uVar9 & 0xff) * 4);
  }
  *t_00 = uVar9;
  return;
}

Assistant:

void CRC32::InitTables() {
  // Compute the table for extending a CRC by one byte.
  Uint32By256* t = new Uint32By256[4];
  FillWordTable(kCrc32cPoly, kCrc32cPoly, 1, t);
  for (int i = 0; i != 256; i++) {
    this->table0_[i] = t[0][i];
  }

  // Construct a table for updating the CRC by 4 bytes data followed by
  // 12 bytes of zeroes.
  //
  // Note: the data word size could be larger than the CRC size; it might
  // be slightly faster to use a 64-bit data word, but doing so doubles the
  // table size.
  uint32_t last = kCrc32cPoly;
  const size_t size = 12;
  for (size_t i = 0; i < size; ++i) {
    last = (last >> 8) ^ this->table0_[last & 0xff];
  }
  FillWordTable(kCrc32cPoly, last, 4, t);
  for (size_t b = 0; b < 4; ++b) {
    for (int i = 0; i < 256; ++i) {
      this->table_[b][i] = t[b][i];
    }
  }

  int j = FillZeroesTable(kCrc32cPoly, t);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->zeroes_)), "");
  for (int i = 0; i < j; i++) {
    this->zeroes_[i] = t[0][i];
  }

  delete[] t;

  // Build up tables for _reversing_ the operation of doing CRC operations on
  // zero bytes.

  // In C++, extending `crc` by a single zero bit is done by the following:
  // (A)  bool low_bit_set = (crc & 1);
  //      crc >>= 1;
  //      if (low_bit_set) crc ^= kCrc32cPoly;
  //
  // In particular note that the high bit of `crc` after this operation will be
  // set if and only if the low bit of `crc` was set before it.  This means that
  // no information is lost, and the operation can be reversed, as follows:
  // (B)  bool high_bit_set = (crc & 0x80000000u);
  //      if (high_bit_set) crc ^= kCrc32cPoly;
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= 1;
  //
  // Or, equivalently:
  // (C)  bool high_bit_set = (crc & 0x80000000u);
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= ((kCrc32cPoly << 1) ^ 1);
  //
  // The last observation is, if we store our checksums in variable `rcrc`,
  // with order of the bits reversed, the inverse operation becomes:
  // (D)  bool low_bit_set = (rcrc & 1);
  //      rcrc >>= 1;
  //      if (low_bit_set) rcrc ^= ReverseBits((kCrc32cPoly << 1) ^ 1)
  //
  // This is the same algorithm (A) that we started with, only with a different
  // polynomial bit pattern.  This means that by building up our tables with
  // this alternate polynomial, we can apply the CRC algorithms to a
  // bit-reversed CRC checksum to perform inverse zero-extension.

  const uint32_t kCrc32cUnextendPoly =
      ReverseBits(static_cast<uint32_t>((kCrc32cPoly << 1) ^ 1));
  FillWordTable(kCrc32cUnextendPoly, kCrc32cUnextendPoly, 1, &reverse_table0_);

  j = FillZeroesTable(kCrc32cUnextendPoly, &reverse_zeroes_);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->reverse_zeroes_)),
                 "");
}